

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.cpp
# Opt level: O1

int __thiscall zmq::sub_t::xsetsockopt(sub_t *this,int option_,void *optval_,size_t optvallen_)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  sub_t *this_00;
  msg_t *pmVar5;
  msg_t msg;
  msg_t local_60;
  
  if (option_ - 8U < 0xfffffffe) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    iVar2 = -1;
  }
  else {
    if (option_ == 6) {
      iVar2 = msg_t::init_subscribe(&local_60,optvallen_,(uchar *)optval_);
    }
    else {
      iVar2 = msg_t::init_cancel(&local_60,optvallen_,(uchar *)optval_);
    }
    if (iVar2 != 0) {
      xsetsockopt();
    }
    pmVar5 = &local_60;
    iVar2 = xsub_t::xsend(&this->super_xsub_t,&local_60);
    iVar3 = (int)pmVar5;
    this_00 = (sub_t *)__errno_location();
    uVar1 = *(undefined4 *)
             &(this_00->super_xsub_t).super_socket_base_t.super_own_t.super_object_t._vptr_object_t;
    iVar3 = msg_t::close(&local_60,iVar3);
    if (iVar3 != 0) {
      xsetsockopt(this_00);
    }
    *(undefined4 *)
     &(this_00->super_xsub_t).super_socket_base_t.super_own_t.super_object_t._vptr_object_t = uVar1;
  }
  return iVar2;
}

Assistant:

int zmq::sub_t::xsetsockopt (int option_,
                             const void *optval_,
                             size_t optvallen_)
{
    if (option_ != ZMQ_SUBSCRIBE && option_ != ZMQ_UNSUBSCRIBE) {
        errno = EINVAL;
        return -1;
    }

    //  Create the subscription message.
    msg_t msg;
    int rc;
    const unsigned char *data = static_cast<const unsigned char *> (optval_);
    if (option_ == ZMQ_SUBSCRIBE) {
        rc = msg.init_subscribe (optvallen_, data);
    } else {
        rc = msg.init_cancel (optvallen_, data);
    }
    errno_assert (rc == 0);

    //  Pass it further on in the stack.
    rc = xsub_t::xsend (&msg);
    return close_and_return (&msg, rc);
}